

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O3

REF_STATUS
ref_search_distance3(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 in_EAX;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  REF_DBL dist;
  double local_38;
  
  dVar13 = *xyz1;
  dVar16 = xyz1[1];
  dVar15 = *xyz0;
  dVar1 = xyz0[1];
  dVar10 = dVar13 - dVar15;
  dVar11 = dVar16 - dVar1;
  dVar2 = xyz1[2];
  dVar3 = xyz0[2];
  dVar25 = dVar2 - dVar3;
  dVar4 = *xyz2;
  dVar5 = xyz2[1];
  dVar6 = xyz2[2];
  dVar21 = dVar5 - dVar1;
  dVar28 = dVar6 - dVar3;
  dVar17 = dVar11 * dVar28 - dVar21 * dVar25;
  dVar12 = dVar4 - dVar15;
  dVar26 = dVar25 * dVar12 - dVar28 * dVar10;
  dVar14 = dVar10 * dVar21 - dVar12 * dVar11;
  dVar22 = *xyz - dVar15;
  dVar19 = xyz[1] - dVar1;
  dVar18 = xyz[2] - dVar3;
  dVar20 = dVar18 * dVar14 + dVar22 * dVar17 + dVar19 * dVar26;
  dVar23 = (dVar22 - dVar17 * dVar20) + dVar15;
  dVar22 = dVar23 - dVar15;
  dVar19 = (dVar19 - dVar26 * dVar20) + dVar1;
  dVar24 = dVar19 - dVar1;
  dVar18 = (dVar18 - dVar20 * dVar14) + dVar3;
  dVar20 = dVar18 - dVar3;
  auVar27._0_8_ =
       dVar14 * ((dVar13 - dVar23) * (dVar5 - dVar19) - (dVar4 - dVar23) * (dVar16 - dVar19)) +
       dVar17 * ((dVar16 - dVar19) * (dVar6 - dVar18) - (dVar5 - dVar19) * (dVar2 - dVar18)) +
       dVar26 * ((dVar2 - dVar18) * (dVar4 - dVar23) - (dVar6 - dVar18) * (dVar13 - dVar23));
  auVar27._8_8_ =
       dVar14 * (dVar22 * dVar21 - dVar12 * dVar24) +
       dVar17 * (dVar24 * dVar28 - dVar21 * dVar20) + dVar26 * (dVar20 * dVar12 - dVar28 * dVar22);
  dVar12 = (dVar24 * dVar10 - dVar22 * dVar11) * dVar14 +
           (dVar11 * dVar20 - dVar24 * dVar25) * dVar17 +
           (dVar25 * dVar22 - dVar20 * dVar10) * dVar26;
  dVar11 = auVar27._0_8_ + auVar27._8_8_ + dVar12;
  dVar10 = dVar11 * 1e+20;
  if (dVar10 <= -dVar10) {
    dVar10 = -dVar10;
  }
  dVar14 = auVar27._0_8_;
  if (auVar27._0_8_ <= -auVar27._0_8_) {
    dVar14 = -auVar27._0_8_;
  }
  if (dVar14 < dVar10) {
    dVar14 = auVar27._8_8_;
    if (auVar27._8_8_ <= -auVar27._8_8_) {
      dVar14 = -auVar27._8_8_;
    }
    if (dVar14 < dVar10) {
      dVar14 = dVar12;
      if (dVar12 <= -dVar12) {
        dVar14 = -dVar12;
      }
      if (dVar14 < dVar10) {
        dVar12 = dVar12 / dVar11;
        auVar7._8_8_ = dVar11;
        auVar7._0_8_ = dVar11;
        auVar27 = divpd(auVar27,auVar7);
        dVar10 = auVar27._0_8_;
        dVar11 = auVar27._8_8_;
        auVar8._8_8_ = -(ulong)(0.0 <= dVar11);
        auVar8._0_8_ = -(ulong)(0.0 <= dVar10);
        iVar9 = movmskpd(in_EAX,auVar8);
        if ((0.0 <= dVar12) && (iVar9 == 3)) {
          dVar15 = (dVar4 * dVar12 + dVar15 * dVar10 + dVar13 * dVar11) - *xyz;
          dVar16 = (dVar5 * dVar12 + dVar1 * dVar10 + dVar16 * dVar11) - xyz[1];
          dVar13 = (dVar6 * dVar12 + dVar3 * dVar10 + dVar2 * dVar11) - xyz[2];
          dVar13 = SQRT(dVar13 * dVar13 + dVar15 * dVar15 + dVar16 * dVar16);
          goto LAB_001eba4a;
        }
      }
    }
  }
  ref_search_distance2(xyz0,xyz1,xyz,&local_38);
  dVar13 = local_38;
  *distance = local_38;
  ref_search_distance2(xyz1,xyz2,xyz,&local_38);
  if (local_38 <= dVar13) {
    dVar13 = local_38;
  }
  *distance = dVar13;
  ref_search_distance2(xyz2,xyz0,xyz,&local_38);
  if (local_38 <= dVar13) {
    dVar13 = local_38;
  }
LAB_001eba4a:
  *distance = dVar13;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_distance3(REF_DBL *xyz0, REF_DBL *xyz1,
                                        REF_DBL *xyz2, REF_DBL *xyz,
                                        REF_DBL *distance) {
  REF_DBL dist;
  REF_DBL bary[3], total, total_normal[3], normal[3];
  REF_DBL dxyz[3];
  REF_DBL xyzp[3];

  RSS(ref_search_xyz_normal(xyz0, xyz1, xyz2, total_normal), "n0");

  /* projects query point to triangle plane */
  xyzp[0] = xyz[0] - xyz0[0];
  xyzp[1] = xyz[1] - xyz0[1];
  xyzp[2] = xyz[2] - xyz0[2];
  total = ref_math_dot(xyzp, total_normal);
  xyzp[0] -= total_normal[0] * total;
  xyzp[1] -= total_normal[1] * total;
  xyzp[2] -= total_normal[2] * total;
  xyzp[0] += xyz0[0];
  xyzp[1] += xyz0[1];
  xyzp[2] += xyz0[2];

  RSS(ref_search_xyz_normal(xyzp, xyz1, xyz2, normal), "n0");
  bary[0] = ref_math_dot(normal, total_normal);
  RSS(ref_search_xyz_normal(xyz0, xyzp, xyz2, normal), "n1");
  bary[1] = ref_math_dot(normal, total_normal);
  RSS(ref_search_xyz_normal(xyz0, xyz1, xyzp, normal), "n2");
  bary[2] = ref_math_dot(normal, total_normal);

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    if (bary[0] >= 0.0 && bary[1] >= 0.0 && bary[2] >= 0.0) {
      dxyz[0] =
          bary[0] * xyz0[0] + bary[1] * xyz1[0] + bary[2] * xyz2[0] - xyz[0];
      dxyz[1] =
          bary[0] * xyz0[1] + bary[1] * xyz1[1] + bary[2] * xyz2[1] - xyz[1];
      dxyz[2] =
          bary[0] * xyz0[2] + bary[1] * xyz1[2] + bary[2] * xyz2[2] - xyz[2];
      *distance = sqrt(ref_math_dot(dxyz, dxyz));
      return REF_SUCCESS;
    }
  }

  RSS(ref_search_distance2(xyz0, xyz1, xyz, &dist), "e01");
  *distance = dist;
  RSS(ref_search_distance2(xyz1, xyz2, xyz, &dist), "e12");
  *distance = MIN(*distance, dist);
  RSS(ref_search_distance2(xyz2, xyz0, xyz, &dist), "e20");
  *distance = MIN(*distance, dist);

  return REF_SUCCESS;
}